

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Syndicated_C2_Req.cpp
# Opt level: O3

bool __thiscall
SRUP_MSG_SYNDICATED_C2_REQ::data(SRUP_MSG_SYNDICATED_C2_REQ *this,uint8_t *data,uint16_t len)

{
  uint8_t *__dest;
  
  (this->super_SRUP_MSG).m_is_serialized = false;
  if (this->m_data != (uint8_t *)0x0) {
    operator_delete__(this->m_data);
  }
  __dest = (uint8_t *)operator_new__((ulong)len);
  this->m_data = __dest;
  memcpy(__dest,data,(ulong)len);
  this->m_data_len = len;
  return true;
}

Assistant:

bool SRUP_MSG_SYNDICATED_C2_REQ::data(const uint8_t *data, const uint16_t len)
{
    m_is_serialized = false;

    if (m_data != nullptr)
        delete[] m_data;

    m_data = new uint8_t[len];
    std::memcpy(m_data, data, len);
    m_data_len = len;
    return true;
}